

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.cpp
# Opt level: O1

void __thiscall ElectricityBill::QueryBill(ElectricityBill *this,Timer *timer)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  size_t *this_00;
  LogLevel LVar1;
  Logger *pLVar2;
  pointer room_info;
  undefined1 local_82e0 [8];
  FileForAppend file;
  __string_type __str;
  undefined1 local_98 [8];
  string room_file_path;
  long local_68;
  pointer local_58;
  undefined1 local_50 [8];
  string result;
  
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 2) {
    higan::Logger::Logger
              ((Logger *)local_82e0,INFO,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/example/ElectricityBill/ElectricityBill.cpp"
               ,0x84,"QueryBill");
    higan::Logger::operator<<((Logger *)local_82e0,"----------Query Bill Start------------");
    higan::Logger::~Logger((Logger *)local_82e0);
  }
  room_info = (this->room_informations_).super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_58 = (this->room_informations_).super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (room_info != local_58) {
    this_00 = &file.write_sum_bytes_;
    do {
      GetRoomFilePathInternal_abi_cxx11_((string *)local_98,this,room_info);
      higan::FileForAppend::FileForAppend((FileForAppend *)local_82e0,(string *)local_98);
      DoQuery_abi_cxx11_((string *)local_50,this,room_info);
      file.write_sum_bytes_ = (size_t)&__str._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)this_00,local_50,result._M_dataplus._M_p + (long)local_50);
      std::__cxx11::string::_M_replace_aux((ulong)this_00,(ulong)__str._M_dataplus._M_p,0,'\x01');
      higan::FileForAppend::Append((FileForAppend *)local_82e0,(string *)this_00);
      if ((size_type *)file.write_sum_bytes_ != &__str._M_string_length) {
        operator_delete((void *)file.write_sum_bytes_,__str._M_string_length + 1);
      }
      LVar1 = higan::Logger::GetLogLevel();
      if ((int)LVar1 < 2) {
        higan::Logger::Logger
                  ((Logger *)this_00,INFO,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/example/ElectricityBill/ElectricityBill.cpp"
                   ,0x8e,"QueryBill");
        pLVar2 = higan::Logger::operator<<((Logger *)this_00,"Query Result: ");
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&room_file_path.field_2 + 8);
        std::operator+(__return_storage_ptr__,&room_info->flatname,&room_info->roomname);
        pLVar2 = higan::Logger::operator<<(pLVar2,__return_storage_ptr__);
        pLVar2 = higan::Logger::operator<<(pLVar2," ");
        higan::Logger::operator<<(pLVar2,(string *)local_50);
        if ((long *)room_file_path.field_2._8_8_ != &stack0xffffffffffffff98) {
          operator_delete((void *)room_file_path.field_2._8_8_,local_68 + 1);
        }
        higan::Logger::~Logger((Logger *)this_00);
      }
      if (local_50 != (undefined1  [8])&result._M_string_length) {
        operator_delete((void *)local_50,result._M_string_length + 1);
      }
      higan::FileForAppend::~FileForAppend((FileForAppend *)local_82e0);
      if (local_98 != (undefined1  [8])&room_file_path._M_string_length) {
        operator_delete((void *)local_98,room_file_path._M_string_length + 1);
      }
      room_info = room_info + 1;
    } while (room_info != local_58);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 2) {
    higan::Logger::Logger
              ((Logger *)local_82e0,INFO,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/example/ElectricityBill/ElectricityBill.cpp"
               ,0x91,"QueryBill");
    higan::Logger::operator<<((Logger *)local_82e0,"----------Query Bill End------------");
    higan::Logger::~Logger((Logger *)local_82e0);
  }
  return;
}

Assistant:

void ElectricityBill::QueryBill(const higan::Timer& timer)
{
	LOG_INFO << "----------Query Bill Start------------";

	for (const auto & room_info : room_informations_)
	{
		std::string room_file_path = GetRoomFilePathInternal(room_info);

		higan::FileForAppend file(room_file_path);
		std::string result =  DoQuery(room_info);

		file.Append(result + '\n');
		LOG_INFO << "Query Result: " << room_info.GetRoomInfoString() << " " << result;
	}

	LOG_INFO << "----------Query Bill End------------";
}